

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  bool bVar1;
  ExecutionModel EVar2;
  Types TVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  Variant *this_00;
  size_t sVar8;
  CompilerError *pCVar9;
  char *pcVar10;
  TypedID *pTVar11;
  SPIRVariable *var_00;
  SPIRType *local_ae8;
  byte local_a14;
  bool local_a13;
  byte local_a12;
  bool local_a11;
  undefined1 local_a08 [32];
  undefined1 local_9e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8 [32];
  uint local_988;
  uint local_984;
  uint32_t i_5;
  uint32_t array_size_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960 [38];
  char local_93a;
  allocator local_939;
  string local_938 [32];
  undefined1 local_918 [40];
  AccessChainMeta meta_7;
  uint32_t indices_7 [2];
  uint32_t i_4;
  uint32_t num_control_points_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0 [38];
  char local_89a;
  allocator local_899;
  string local_898 [32];
  undefined1 local_878 [32];
  undefined1 local_858 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818 [36];
  uint local_7f4;
  string local_7f0 [4];
  uint32_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0 [32];
  undefined1 local_7b0 [44];
  AccessChainMeta meta_6;
  uint32_t indices_6 [2];
  uint32_t j_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758 [36];
  uint local_734;
  SPIRType *pSStack_730;
  uint32_t i_2;
  SPIRType *matrix_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708 [36];
  uint32_t local_6e4;
  uint32_t local_6e0;
  uint32_t num_control_points_2;
  uint32_t base_interface_index_1;
  char local_6b2;
  allocator local_6b1;
  string local_6b0 [39];
  char local_689;
  undefined1 local_688 [7];
  bool is_array_of_matrix;
  undefined1 local_668 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [32];
  undefined1 local_608 [40];
  AccessChainMeta meta_5;
  uint32_t indices_5 [2];
  undefined1 local_5b8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  undefined1 local_558 [44];
  AccessChainMeta meta_4;
  uint32_t indices_4 [2];
  uint32_t k_2;
  undefined1 local_500 [64];
  undefined1 local_4c0 [44];
  AccessChainMeta meta_3;
  uint32_t indices_3 [3];
  uint32_t k_1;
  uint32_t array_size_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [32];
  undefined1 local_3c0 [44];
  AccessChainMeta meta_2;
  uint32_t indices_2 [2];
  uint32_t k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368 [32];
  SPIRType *local_348;
  SPIRType *expr_mbr_type;
  SPIRType *mbr_type;
  string local_330 [36];
  uint local_30c;
  string local_308 [4];
  uint32_t j_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [36];
  uint local_2c4;
  __node_base _Stack_2c0;
  uint32_t i_1;
  SPIRType *struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  uint32_t local_278;
  undefined1 local_272;
  allocator local_271;
  uint32_t num_control_points_1;
  byte local_249;
  undefined1 local_248 [7];
  bool is_array_of_struct;
  AccessChainMeta local_224;
  AccessChainMeta meta_1;
  uint32_t indices_1 [2];
  uint32_t j_1;
  AccessChainMeta local_1ec;
  AccessChainMeta meta;
  uint32_t indices [3];
  uint32_t j;
  uint32_t array_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [36];
  uint local_18c;
  __node_base _Stack_188;
  uint32_t i;
  SPIRType *sub_type;
  uint32_t base_interface_index;
  uint32_t num_control_points;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [38];
  char local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  char local_e2;
  allocator local_e1;
  string local_e0 [38];
  char local_ba;
  allocator local_b9;
  string local_b8 [32];
  __node_base local_98;
  SPIRType *iface_type;
  SPIRType *expr_type;
  SPIRVariable *pSStack_80;
  bool ptr_is_io_variable;
  SPIRVariable *var;
  uint32_t local_64;
  string local_60 [4];
  uint32_t interface_index;
  string expr;
  ID local_40;
  byte local_3c;
  bool local_3b;
  byte local_3a;
  bool local_39;
  bool flat_data_type;
  bool flat_struct;
  bool flat_matrix;
  SPIRType *pSStack_38;
  bool multi_patch_tess_ctl;
  SPIRType *result_type;
  SPIRType *ptr_type;
  float local_20;
  uint32_t ptr_local;
  uint32_t id_local;
  uint32_t result_type_id_local;
  CompilerMSL *this_local;
  
  ptr_type._4_4_ = ptr;
  local_20 = (float)id;
  ptr_local = result_type_id;
  _id_local = (_Hash_node_base *)this;
  result_type = Compiler::expression_type((Compiler *)this,ptr);
  pSStack_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,ptr_local);
  if ((result_type->storage == StorageClassInput) || (result_type->storage == StorageClassOutput)) {
    if ((result_type->storage == StorageClassOutput) &&
       (EVar2 = Compiler::get_execution_model((Compiler *)this),
       EVar2 == ExecutionModelTessellationEvaluation)) {
      this_local._7_1_ = 0;
    }
    else {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      local_a11 = false;
      if ((EVar2 == ExecutionModelTessellationControl) &&
         (local_a11 = false, ((this->msl_options).multi_patch_workgroup & 1U) != 0)) {
        local_a11 = result_type->storage == StorageClassInput;
      }
      local_39 = local_a11;
      bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_38);
      local_a12 = 0;
      if ((bVar1) && (local_a12 = 0, result_type->storage == StorageClassInput)) {
        local_a12 = local_39 ^ 0xff;
      }
      local_3a = local_a12 & 1;
      local_a13 = false;
      if (*(int *)&(pSStack_38->super_IVariant).field_0xc == 0xf) {
        local_a13 = result_type->storage == StorageClassInput;
      }
      local_3b = local_a13;
      local_a14 = 1;
      if (local_3a == 0) {
        bVar1 = Compiler::is_array((Compiler *)this,pSStack_38);
        local_a14 = 1;
        if (!bVar1) {
          local_a14 = local_3b;
        }
      }
      local_3c = local_a14 & 1;
      if (local_3c == 0) {
        this_local._7_1_ = 0;
      }
      else {
        TypedID<(spirv_cross::Types)0>::TypedID(&local_40,ptr_type._4_4_);
        bVar1 = Compiler::has_decoration((Compiler *)this,local_40,DecorationPatch);
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        else {
          ::std::__cxx11::string::string(local_60);
          local_64 = Compiler::get_extended_decoration
                               ((Compiler *)this,ptr_type._4_4_,
                                SPIRVCrossDecorationInterfaceMemberIndex);
          pSStack_80 = Compiler::maybe_get_backing_variable((Compiler *)this,ptr_type._4_4_);
          this_00 = VectorView<spirv_cross::Variant>::operator[]
                              (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>,(ulong)ptr_type._4_4_);
          TVar3 = Variant::get_type(this_00);
          expr_type._7_1_ = TVar3 == TypeVariable;
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(result_type->super_IVariant).self);
          iface_type = Compiler::get_pointee_type((Compiler *)this,uVar4);
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
          local_98._M_nxt = (_Hash_node_base *)Compiler::expression_type((Compiler *)this,uVar4);
          sVar8 = VectorView<unsigned_int>::size
                            (&(pSStack_38->array).super_VectorView<unsigned_int>);
          if (2 < sVar8) {
            local_ba = '\x01';
            pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_b8,"Cannot load tessellation IO variables with more than 2 dimensions."
                       ,&local_b9);
            CompilerError::CompilerError(pCVar9,(string *)local_b8);
            local_ba = '\0';
            __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          sVar8 = VectorView<unsigned_int>::size
                            (&(pSStack_38->array).super_VectorView<unsigned_int>);
          uVar4 = (uint32_t)this;
          if (sVar8 == 2) {
            if ((expr_type._7_1_ & 1) == 0) {
              local_e2 = '\x01';
              pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_e0,
                         "Loading an array-of-array must be loaded directly from an IO variable.",
                         &local_e1);
              CompilerError::CompilerError(pCVar9,(string *)local_e0);
              local_e2 = '\0';
              __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if (local_64 == 0xffffffff) {
              local_10a = 1;
              pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_108,"Interface index is unknown. Cannot continue.",&local_109);
              CompilerError::CompilerError(pCVar9,(string *)local_108);
              local_10a = AddressingModelLogical >> 0x10;
              __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if ((*(int *)&(pSStack_38->super_IVariant).field_0xc == 0xf) || ((local_3a & 1) != 0)) {
              local_132 = '\x01';
              pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_130,
                         "Cannot load array-of-array of composite type in tessellation IO.",
                         &local_131);
              CompilerError::CompilerError(pCVar9,(string *)local_130);
              local_132 = '\0';
              __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&base_interface_index,this,pSStack_38,0);
            ::std::operator+(local_158,(char *)&base_interface_index);
            ::std::__cxx11::string::operator+=(local_60,(string *)local_158);
            ::std::__cxx11::string::~string((string *)local_158);
            ::std::__cxx11::string::~string((string *)&base_interface_index);
            sub_type._4_4_ =
                 CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_38,1);
            sub_type._0_4_ = local_64;
            uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_38->parent_type);
            _Stack_188._M_nxt =
                 (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            for (local_18c = 0; local_18c < sub_type._4_4_; local_18c = local_18c + 1) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&j,this,_Stack_188._M_nxt,0);
              ::std::operator+(local_1b0,(char *)&j);
              ::std::__cxx11::string::operator+=(local_60,(string *)local_1b0);
              ::std::__cxx11::string::~string((string *)local_1b0);
              ::std::__cxx11::string::~string((string *)&j);
              local_64 = (uint32_t)sub_type;
              uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_38,0);
              if ((local_39 & 1U) == 0) {
                for (indices_1[0] = 0; indices_1[0] < uVar5; indices_1[0] = indices_1[0] + 1) {
                  meta_1.storage_physical_type = local_18c;
                  meta_1.need_transpose = (bool)(undefined1)local_64;
                  meta_1.storage_is_packed = (bool)local_64._1_1_;
                  meta_1.storage_is_invariant = (bool)local_64._2_1_;
                  meta_1.flattened_struct = (bool)local_64._3_1_;
                  AccessChainMeta::AccessChainMeta(&local_224);
                  uVar6 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&this->stage_in_ptr_var_id);
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            ((CompilerGLSL *)local_248,uVar4,(uint32_t *)(ulong)uVar6,
                             (uint32_t)&meta_1,2,(AccessChainMeta *)0x5);
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_248);
                  ::std::__cxx11::string::~string((string *)local_248);
                  bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_188._M_nxt);
                  if (((!bVar1) && (*(int *)((ID *)(_Stack_188._M_nxt + 1) + 1) != 0xf)) &&
                     (*(uint32_t *)((long)(_Stack_188._M_nxt + 2) + 4) < iface_type->vecsize)) {
                    pcVar10 = CompilerGLSL::vector_swizzle
                                        (*(uint32_t *)((long)(_Stack_188._M_nxt + 2) + 4),0);
                    ::std::__cxx11::string::operator+=(local_60,pcVar10);
                  }
                  if (indices_1[0] + 1 < uVar5) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                  local_64 = local_64 + 1;
                }
              }
              else {
                for (indices[1] = 0; indices[1] < uVar5; indices[1] = indices[1] + 1) {
                  meta.storage_physical_type = local_18c;
                  meta.need_transpose = (bool)(undefined1)local_64;
                  meta.storage_is_packed = (bool)local_64._1_1_;
                  meta.storage_is_invariant = (bool)local_64._2_1_;
                  meta.flattened_struct = (bool)local_64._3_1_;
                  AccessChainMeta::AccessChainMeta(&local_1ec);
                  uVar6 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&this->stage_in_ptr_var_id);
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            ((CompilerGLSL *)(indices_1 + 1),uVar4,(uint32_t *)(ulong)uVar6,
                             (uint32_t)&meta,3,(AccessChainMeta *)0x5);
                  ::std::__cxx11::string::operator+=(local_60,(string *)(indices_1 + 1));
                  ::std::__cxx11::string::~string((string *)(indices_1 + 1));
                  bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_188._M_nxt);
                  if (((!bVar1) && (*(int *)((ID *)(_Stack_188._M_nxt + 1) + 1) != 0xf)) &&
                     (*(uint32_t *)((long)(_Stack_188._M_nxt + 2) + 4) < iface_type->vecsize)) {
                    pcVar10 = CompilerGLSL::vector_swizzle
                                        (*(uint32_t *)((long)(_Stack_188._M_nxt + 2) + 4),0);
                    ::std::__cxx11::string::operator+=(local_60,pcVar10);
                  }
                  if (indices[1] + 1 < uVar5) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                }
              }
              ::std::__cxx11::string::operator+=(local_60," })");
              if (local_18c + 1 < sub_type._4_4_) {
                ::std::__cxx11::string::operator+=(local_60,", ");
              }
            }
            ::std::__cxx11::string::operator+=(local_60," })");
          }
          else if ((local_3b & 1U) == 0) {
            if ((local_3a & 1) == 0) {
              if ((expr_type._7_1_ & 1) == 0) {
                bVar1 = Compiler::is_array((Compiler *)this,pSStack_38);
                if (!bVar1) {
                  __assert_fail("is_array(result_type)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x175d,
                                "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                               );
                }
                sVar8 = VectorView<unsigned_int>::size
                                  (&(pSStack_38->array).super_VectorView<unsigned_int>);
                if (sVar8 != 1) {
                  __assert_fail("result_type.array.size() == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x175e,
                                "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                               );
                }
                if (local_64 == 0xffffffff) {
                  local_93a = '\x01';
                  pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_938,"Interface index is unknown. Cannot continue.",&local_939);
                  CompilerError::CompilerError(pCVar9,(string *)local_938);
                  local_93a = '\0';
                  __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
                }
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&i_5,this,pSStack_38,0);
                ::std::operator+(local_960,(char *)&i_5);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_960);
                ::std::__cxx11::string::~string((string *)local_960);
                ::std::__cxx11::string::~string((string *)&i_5);
                local_984 = CompilerGLSL::to_array_size_literal
                                      (&this->super_CompilerGLSL,pSStack_38,0);
                for (local_988 = 0; local_988 < local_984; local_988 = local_988 + 1) {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((CompilerGLSL *)local_9e8,uVar4,SUB41(ptr_type._4_4_,0));
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_9e8 + 0x20),local_9e8);
                  CompilerGLSL::to_member_name_abi_cxx11_
                            ((CompilerGLSL *)local_a08,(SPIRType *)this,(uint32_t)local_98._M_nxt);
                  ::std::operator+(local_9a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_9e8 + 0x20));
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_9a8);
                  ::std::__cxx11::string::~string((string *)local_9a8);
                  ::std::__cxx11::string::~string((string *)local_a08);
                  ::std::__cxx11::string::~string((string *)(local_9e8 + 0x20));
                  ::std::__cxx11::string::~string((string *)local_9e8);
                  if (pSStack_38->vecsize < iface_type->vecsize) {
                    pcVar10 = CompilerGLSL::vector_swizzle(pSStack_38->vecsize,0);
                    ::std::__cxx11::string::operator+=(local_60,pcVar10);
                  }
                  if (local_988 + 1 < local_984) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                  local_64 = local_64 + 1;
                }
                ::std::__cxx11::string::operator+=(local_60," })");
              }
              else {
                bVar1 = Compiler::is_array((Compiler *)this,pSStack_38);
                if (!bVar1) {
                  __assert_fail("is_array(result_type)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x1741,
                                "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                               );
                }
                sVar8 = VectorView<unsigned_int>::size
                                  (&(pSStack_38->array).super_VectorView<unsigned_int>);
                if (sVar8 != 1) {
                  __assert_fail("result_type.array.size() == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x1742,
                                "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                               );
                }
                if (local_64 == 0xffffffff) {
                  local_89a = '\x01';
                  pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_898,"Interface index is unknown. Cannot continue.",&local_899);
                  CompilerError::CompilerError(pCVar9,(string *)local_898);
                  local_89a = '\0';
                  __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
                }
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&i_4,this,pSStack_38,0);
                ::std::operator+(local_8c0,(char *)&i_4);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_8c0);
                ::std::__cxx11::string::~string((string *)local_8c0);
                ::std::__cxx11::string::~string((string *)&i_4);
                uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_38,0);
                for (indices_7[0] = 0; indices_7[0] < uVar5; indices_7[0] = indices_7[0] + 1) {
                  meta_7.storage_physical_type = indices_7[0];
                  meta_7.need_transpose = (bool)(undefined1)local_64;
                  meta_7.storage_is_packed = (bool)local_64._1_1_;
                  meta_7.storage_is_invariant = (bool)local_64._2_1_;
                  meta_7.flattened_struct = (bool)local_64._3_1_;
                  AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_918 + 0x20));
                  uVar6 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&this->stage_in_ptr_var_id);
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            ((CompilerGLSL *)local_918,uVar4,(uint32_t *)(ulong)uVar6,
                             (uint32_t)&meta_7,2,(AccessChainMeta *)0x5);
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_918);
                  ::std::__cxx11::string::~string((string *)local_918);
                  if (pSStack_38->vecsize < iface_type->vecsize) {
                    pcVar10 = CompilerGLSL::vector_swizzle(pSStack_38->vecsize,0);
                    ::std::__cxx11::string::operator+=(local_60,pcVar10);
                  }
                  if (indices_7[0] + 1 < uVar5) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                }
                ::std::__cxx11::string::operator+=(local_60," })");
              }
            }
            else {
              local_689 = Compiler::is_array((Compiler *)this,pSStack_38);
              if (((bool)local_689) && ((expr_type._7_1_ & 1) == 0)) {
                local_6b2 = '\x01';
                pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_6b0,
                           "Loading array of matrix from IO variable must come directly from IO variable."
                           ,&local_6b1);
                CompilerError::CompilerError(pCVar9,(string *)local_6b0);
                local_6b2 = '\0';
                __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              if (local_64 == 0xffffffff) {
                num_control_points_2._2_1_ = 1;
                pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&base_interface_index_1,
                           "Interface index is unknown. Cannot continue.",
                           (allocator *)((long)&num_control_points_2 + 3));
                CompilerError::CompilerError(pCVar9,(string *)&base_interface_index_1);
                num_control_points_2._2_1_ = 0;
                __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              if ((bool)local_689) {
                local_6e0 = local_64;
                local_6e4 = CompilerGLSL::to_array_size_literal
                                      (&this->super_CompilerGLSL,pSStack_38,0);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&matrix_type,this,pSStack_38,0);
                ::std::operator+(local_708,(char *)&matrix_type);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_708);
                ::std::__cxx11::string::~string((string *)local_708);
                ::std::__cxx11::string::~string((string *)&matrix_type);
                var_00 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ptr_type._4_4_);
                pSStack_730 = Compiler::get_variable_element_type((Compiler *)this,var_00);
                for (local_734 = 0; local_734 < local_6e4; local_734 = local_734 + 1) {
                  local_64 = local_6e0;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (indices_6 + 1,this,pSStack_730,0);
                  ::std::operator+(local_758,(char *)(indices_6 + 1));
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_758);
                  ::std::__cxx11::string::~string((string *)local_758);
                  ::std::__cxx11::string::~string((string *)(indices_6 + 1));
                  for (indices_6[0] = 0; indices_6[0] < pSStack_38->columns;
                      indices_6[0] = indices_6[0] + 1) {
                    meta_6.storage_physical_type = local_734;
                    meta_6.need_transpose = (bool)(undefined1)local_64;
                    meta_6.storage_is_packed = (bool)local_64._1_1_;
                    meta_6.storage_is_invariant = (bool)local_64._2_1_;
                    meta_6.flattened_struct = (bool)local_64._3_1_;
                    AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_7b0 + 0x24));
                    uVar5 = TypedID::operator_cast_to_unsigned_int
                                      ((TypedID *)&this->stage_in_ptr_var_id);
                    CompilerGLSL::access_chain_internal_abi_cxx11_
                              ((CompilerGLSL *)local_7b0,uVar4,(uint32_t *)(ulong)uVar5,
                               (uint32_t)&meta_6,2,(AccessChainMeta *)0x5);
                    ::std::__cxx11::string::operator+=(local_60,(string *)local_7b0);
                    ::std::__cxx11::string::~string((string *)local_7b0);
                    if (pSStack_38->vecsize < iface_type->vecsize) {
                      pcVar10 = CompilerGLSL::vector_swizzle(pSStack_38->vecsize,0);
                      ::std::__cxx11::string::operator+=(local_60,pcVar10);
                    }
                    if (indices_6[0] + 1 < pSStack_38->columns) {
                      ::std::__cxx11::string::operator+=(local_60,", ");
                    }
                    local_64 = local_64 + 1;
                  }
                  ::std::__cxx11::string::operator+=(local_60,")");
                  if (local_734 + 1 < local_6e4) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                }
                ::std::__cxx11::string::operator+=(local_60," })");
              }
              else {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_7f0,this,pSStack_38,0);
                ::std::operator+(local_7d0,(char *)local_7f0);
                ::std::__cxx11::string::operator+=(local_60,(string *)local_7d0);
                ::std::__cxx11::string::~string((string *)local_7d0);
                ::std::__cxx11::string::~string(local_7f0);
                for (local_7f4 = 0; local_7f4 < pSStack_38->columns; local_7f4 = local_7f4 + 1) {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((CompilerGLSL *)local_858,uVar4,SUB41(ptr_type._4_4_,0));
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_858 + 0x20),local_858);
                  CompilerGLSL::to_member_name_abi_cxx11_
                            ((CompilerGLSL *)local_878,(SPIRType *)this,(uint32_t)local_98._M_nxt);
                  ::std::operator+(local_818,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_858 + 0x20));
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_818);
                  ::std::__cxx11::string::~string((string *)local_818);
                  ::std::__cxx11::string::~string((string *)local_878);
                  ::std::__cxx11::string::~string((string *)(local_858 + 0x20));
                  ::std::__cxx11::string::~string((string *)local_858);
                  if (pSStack_38->vecsize < iface_type->vecsize) {
                    pcVar10 = CompilerGLSL::vector_swizzle(pSStack_38->vecsize,0);
                    ::std::__cxx11::string::operator+=(local_60,pcVar10);
                  }
                  if (local_7f4 + 1 < pSStack_38->columns) {
                    ::std::__cxx11::string::operator+=(local_60,", ");
                  }
                  local_64 = local_64 + 1;
                }
                ::std::__cxx11::string::operator+=(local_60,")");
              }
            }
          }
          else {
            local_249 = Compiler::is_array((Compiler *)this,pSStack_38);
            if (((bool)local_249) && ((expr_type._7_1_ & 1) == 0)) {
              local_272 = 1;
              pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&num_control_points_1,
                         "Loading array of struct from IO variable must come directly from IO variable."
                         ,&local_271);
              CompilerError::CompilerError(pCVar9,(string *)&num_control_points_1);
              local_272 = AddressingModelLogical >> 0x10;
              __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            local_278 = 1;
            if ((bool)local_249) {
              local_278 = CompilerGLSL::to_array_size_literal
                                    (&this->super_CompilerGLSL,pSStack_38,0);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&struct_type,this,pSStack_38,0);
              ::std::operator+(local_298,(char *)&struct_type);
              ::std::__cxx11::string::operator+=(local_60,(string *)local_298);
              ::std::__cxx11::string::~string((string *)local_298);
              ::std::__cxx11::string::~string((string *)&struct_type);
            }
            if ((local_249 & 1) == 0) {
              local_ae8 = pSStack_38;
            }
            else {
              uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_38->parent_type);
              local_ae8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            }
            _Stack_2c0._M_nxt = (_Hash_node_base *)local_ae8;
            bVar1 = VectorView<unsigned_int>::empty
                              (&(local_ae8->array).super_VectorView<unsigned_int>);
            if (!bVar1) {
              __assert_fail("struct_type.array.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x1693,
                            "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                           );
            }
            for (local_2c4 = 0; local_2c4 < local_278; local_2c4 = local_2c4 + 1) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (local_308,this,_Stack_2c0._M_nxt,0);
              ::std::operator+(local_2e8,(char *)local_308);
              ::std::__cxx11::string::operator+=(local_60,(string *)local_2e8);
              ::std::__cxx11::string::~string((string *)local_2e8);
              ::std::__cxx11::string::~string(local_308);
              for (local_30c = 0; uVar7 = local_30c,
                  sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                     (_Stack_2c0._M_nxt + 0x11)), uVar7 < (uint)sVar8;
                  local_30c = local_30c + 1) {
                if (pSStack_80 != (SPIRVariable *)0x0) {
                  uVar5 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(pSStack_80->super_IVariant).self);
                  local_64 = Compiler::get_extended_member_decoration
                                       ((Compiler *)this,uVar5,local_30c,
                                        SPIRVCrossDecorationInterfaceMemberIndex);
                }
                if (local_64 == 0xffffffff) {
                  mbr_type._6_1_ = 1;
                  pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_330,"Interface index is unknown. Cannot continue.",
                             (allocator *)((long)&mbr_type + 7));
                  CompilerError::CompilerError(pCVar9,(string *)local_330);
                  mbr_type._6_1_ = 0;
                  __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
                }
                pTVar11 = (TypedID *)
                          VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                     (_Stack_2c0._M_nxt + 0x11),(ulong)local_30c);
                uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
                expr_mbr_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
                pTVar11 = (TypedID *)
                          VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                    (&(iface_type->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                     ,(ulong)local_30c);
                uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
                local_348 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
                bVar1 = Compiler::is_matrix((Compiler *)this,expr_mbr_type);
                if (((bVar1) && (result_type->storage == StorageClassInput)) &&
                   ((local_39 & 1U) == 0)) {
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (indices_2 + 1,this,expr_mbr_type,0);
                  ::std::operator+(local_368,(char *)(indices_2 + 1));
                  ::std::__cxx11::string::operator+=(local_60,(string *)local_368);
                  ::std::__cxx11::string::~string((string *)local_368);
                  ::std::__cxx11::string::~string((string *)(indices_2 + 1));
                  for (indices_2[0] = 0; indices_2[0] < expr_mbr_type->columns;
                      indices_2[0] = indices_2[0] + 1) {
                    if ((local_249 & 1) == 0) {
                      CompilerGLSL::to_expression_abi_cxx11_
                                ((CompilerGLSL *)local_420,uVar4,SUB41(ptr_type._4_4_,0));
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_420 + 0x20),local_420);
                      CompilerGLSL::to_member_name_abi_cxx11_
                                ((CompilerGLSL *)local_440,(SPIRType *)this,
                                 (uint32_t)local_98._M_nxt);
                      ::std::operator+(local_3e0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_420 + 0x20));
                      ::std::__cxx11::string::operator+=(local_60,(string *)local_3e0);
                      ::std::__cxx11::string::~string((string *)local_3e0);
                      ::std::__cxx11::string::~string((string *)local_440);
                      ::std::__cxx11::string::~string((string *)(local_420 + 0x20));
                      ::std::__cxx11::string::~string((string *)local_420);
                    }
                    else {
                      meta_2.storage_physical_type = local_2c4;
                      meta_2.need_transpose = (bool)(undefined1)local_64;
                      meta_2.storage_is_packed = (bool)local_64._1_1_;
                      meta_2.storage_is_invariant = (bool)local_64._2_1_;
                      meta_2.flattened_struct = (bool)local_64._3_1_;
                      AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_3c0 + 0x24));
                      uVar5 = TypedID::operator_cast_to_unsigned_int
                                        ((TypedID *)&this->stage_in_ptr_var_id);
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                ((CompilerGLSL *)local_3c0,uVar4,(uint32_t *)(ulong)uVar5,
                                 (uint32_t)&meta_2,2,(AccessChainMeta *)0x5);
                      ::std::__cxx11::string::operator+=(local_60,(string *)local_3c0);
                      ::std::__cxx11::string::~string((string *)local_3c0);
                    }
                    if (expr_mbr_type->vecsize < local_348->vecsize) {
                      pcVar10 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                      ::std::__cxx11::string::operator+=(local_60,pcVar10);
                    }
                    if (indices_2[0] + 1 < expr_mbr_type->columns) {
                      ::std::__cxx11::string::operator+=(local_60,", ");
                    }
                    local_64 = local_64 + 1;
                  }
                  ::std::__cxx11::string::operator+=(local_60,")");
                }
                else {
                  bVar1 = Compiler::is_array((Compiler *)this,expr_mbr_type);
                  if (bVar1) {
                    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                              (&k_1,this,expr_mbr_type,0);
                    ::std::operator+(local_460,(char *)&k_1);
                    ::std::__cxx11::string::operator+=(local_60,(string *)local_460);
                    ::std::__cxx11::string::~string((string *)local_460);
                    ::std::__cxx11::string::~string((string *)&k_1);
                    indices_3[2] = CompilerGLSL::to_array_size_literal
                                             (&this->super_CompilerGLSL,expr_mbr_type,0);
                    if ((local_39 & 1U) == 0) {
                      for (indices_4[0] = 0; indices_4[0] < indices_3[2];
                          indices_4[0] = indices_4[0] + 1) {
                        if ((local_249 & 1) == 0) {
                          CompilerGLSL::to_expression_abi_cxx11_
                                    ((CompilerGLSL *)local_5b8,uVar4,SUB41(ptr_type._4_4_,0));
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(local_5b8 + 0x20),local_5b8);
                          CompilerGLSL::to_member_name_abi_cxx11_
                                    ((CompilerGLSL *)indices_5,(SPIRType *)this,
                                     (uint32_t)local_98._M_nxt);
                          ::std::operator+(local_578,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(local_5b8 + 0x20));
                          ::std::__cxx11::string::operator+=(local_60,(string *)local_578);
                          ::std::__cxx11::string::~string((string *)local_578);
                          ::std::__cxx11::string::~string((string *)indices_5);
                          ::std::__cxx11::string::~string((string *)(local_5b8 + 0x20));
                          ::std::__cxx11::string::~string((string *)local_5b8);
                        }
                        else {
                          meta_4.storage_physical_type = local_2c4;
                          meta_4.need_transpose = (bool)(undefined1)local_64;
                          meta_4.storage_is_packed = (bool)local_64._1_1_;
                          meta_4.storage_is_invariant = (bool)local_64._2_1_;
                          meta_4.flattened_struct = (bool)local_64._3_1_;
                          AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_558 + 0x24));
                          uVar5 = TypedID::operator_cast_to_unsigned_int
                                            ((TypedID *)&this->stage_in_ptr_var_id);
                          CompilerGLSL::access_chain_internal_abi_cxx11_
                                    ((CompilerGLSL *)local_558,uVar4,(uint32_t *)(ulong)uVar5,
                                     (uint32_t)&meta_4,2,(AccessChainMeta *)0x5);
                          ::std::__cxx11::string::operator+=(local_60,(string *)local_558);
                          ::std::__cxx11::string::~string((string *)local_558);
                        }
                        if (expr_mbr_type->vecsize < local_348->vecsize) {
                          pcVar10 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                          ::std::__cxx11::string::operator+=(local_60,pcVar10);
                        }
                        if (indices_4[0] + 1 < indices_3[2]) {
                          ::std::__cxx11::string::operator+=(local_60,", ");
                        }
                        local_64 = local_64 + 1;
                      }
                    }
                    else {
                      for (indices_3[1] = 0; indices_3[1] < indices_3[2];
                          indices_3[1] = indices_3[1] + 1) {
                        if ((local_249 & 1) == 0) {
                          CompilerGLSL::to_expression_abi_cxx11_
                                    ((CompilerGLSL *)local_500,uVar4,SUB41(ptr_type._4_4_,0));
                          CompilerGLSL::to_member_name_abi_cxx11_
                                    ((CompilerGLSL *)(indices_4 + 1),(SPIRType *)this,
                                     (uint32_t)local_98._M_nxt);
                          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                                    ((spirv_cross *)(local_500 + 0x20),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_500,(char (*) [2])0x4dfd16,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(indices_4 + 1),(char (*) [2])0x4f1699,indices_3 + 1,
                                     (char (*) [2])0x4e3676);
                          ::std::__cxx11::string::operator+=(local_60,(string *)(local_500 + 0x20));
                          ::std::__cxx11::string::~string((string *)(local_500 + 0x20));
                          ::std::__cxx11::string::~string((string *)(indices_4 + 1));
                          ::std::__cxx11::string::~string((string *)local_500);
                        }
                        else {
                          meta_3.storage_physical_type = local_2c4;
                          meta_3.need_transpose = (bool)(undefined1)local_64;
                          meta_3.storage_is_packed = (bool)local_64._1_1_;
                          meta_3.storage_is_invariant = (bool)local_64._2_1_;
                          meta_3.flattened_struct = (bool)local_64._3_1_;
                          indices_3[0] = indices_3[1];
                          AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_4c0 + 0x24));
                          uVar5 = TypedID::operator_cast_to_unsigned_int
                                            ((TypedID *)&this->stage_in_ptr_var_id);
                          CompilerGLSL::access_chain_internal_abi_cxx11_
                                    ((CompilerGLSL *)local_4c0,uVar4,(uint32_t *)(ulong)uVar5,
                                     (uint32_t)&meta_3,3,(AccessChainMeta *)0x5);
                          ::std::__cxx11::string::operator+=(local_60,(string *)local_4c0);
                          ::std::__cxx11::string::~string((string *)local_4c0);
                        }
                        if (expr_mbr_type->vecsize < local_348->vecsize) {
                          pcVar10 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                          ::std::__cxx11::string::operator+=(local_60,pcVar10);
                        }
                        if (indices_3[1] + 1 < indices_3[2]) {
                          ::std::__cxx11::string::operator+=(local_60,", ");
                        }
                      }
                    }
                    ::std::__cxx11::string::operator+=(local_60," })");
                  }
                  else {
                    if ((local_249 & 1) == 0) {
                      CompilerGLSL::to_expression_abi_cxx11_
                                ((CompilerGLSL *)local_668,uVar4,SUB41(ptr_type._4_4_,0));
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_668 + 0x20),local_668);
                      CompilerGLSL::to_member_name_abi_cxx11_
                                ((CompilerGLSL *)local_688,(SPIRType *)this,
                                 (uint32_t)local_98._M_nxt);
                      ::std::operator+(local_628,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_668 + 0x20));
                      ::std::__cxx11::string::operator+=(local_60,(string *)local_628);
                      ::std::__cxx11::string::~string((string *)local_628);
                      ::std::__cxx11::string::~string((string *)local_688);
                      ::std::__cxx11::string::~string((string *)(local_668 + 0x20));
                      ::std::__cxx11::string::~string((string *)local_668);
                    }
                    else {
                      meta_5.storage_physical_type = local_2c4;
                      meta_5.need_transpose = (bool)(undefined1)local_64;
                      meta_5.storage_is_packed = (bool)local_64._1_1_;
                      meta_5.storage_is_invariant = (bool)local_64._2_1_;
                      meta_5.flattened_struct = (bool)local_64._3_1_;
                      AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_608 + 0x20));
                      uVar5 = TypedID::operator_cast_to_unsigned_int
                                        ((TypedID *)&this->stage_in_ptr_var_id);
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                ((CompilerGLSL *)local_608,uVar4,(uint32_t *)(ulong)uVar5,
                                 (uint32_t)&meta_5,2,(AccessChainMeta *)0x5);
                      ::std::__cxx11::string::operator+=(local_60,(string *)local_608);
                      ::std::__cxx11::string::~string((string *)local_608);
                    }
                    if (expr_mbr_type->vecsize < local_348->vecsize) {
                      pcVar10 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                      ::std::__cxx11::string::operator+=(local_60,pcVar10);
                    }
                  }
                }
                uVar7 = local_30c + 1;
                sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                   (_Stack_2c0._M_nxt + 0x11));
                if (uVar7 < sVar8) {
                  ::std::__cxx11::string::operator+=(local_60,", ");
                }
              }
              ::std::__cxx11::string::operator+=(local_60," }");
              if (local_2c4 + 1 < local_278) {
                ::std::__cxx11::string::operator+=(local_60,", ");
              }
            }
            if ((local_249 & 1) != 0) {
              ::std::__cxx11::string::operator+=(local_60," })");
            }
          }
          CompilerGLSL::emit_op
                    (&this->super_CompilerGLSL,ptr_local,(uint32_t)local_20,(string *)local_60,false
                     ,false);
          Compiler::register_read((Compiler *)this,(uint32_t)local_20,ptr_type._4_4_,false);
          this_local._7_1_ = 1;
          ::std::__cxx11::string::~string(local_60);
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationEvaluation)
		return false;

	bool multi_patch_tess_ctl = get_execution_model() == ExecutionModelTessellationControl &&
	                            msl_options.multi_patch_workgroup && ptr_type.storage == StorageClassInput;
	bool flat_matrix = is_matrix(result_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl;
	bool flat_struct = result_type.basetype == SPIRType::Struct && ptr_type.storage == StorageClassInput;
	bool flat_data_type = flat_matrix || is_array(result_type) || flat_struct;
	if (!flat_data_type)
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || flat_matrix)
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			if (multi_patch_tess_ctl)
			{
				for (uint32_t j = 0; j < array_size; j++)
				{
					const uint32_t indices[3] = { i, interface_index, j };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 3,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					// If the expression has more vector components than the result type, insert
					// a swizzle. This shouldn't happen normally on valid SPIR-V, but it might
					// happen if we replace the type of an input variable.
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			else
			{
				for (uint32_t j = 0; j < array_size; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (flat_struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
							    stage_in_ptr_var_id, indices, 2,
							    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					if (multi_patch_tess_ctl)
					{
						for (uint32_t k = 0; k < array_size; k++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[3] = { i, interface_index, k };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 3,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += join(to_expression(ptr), ".", to_member_name(iface_type, interface_index), "[",
								             k, "]");
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					else
					{
						for (uint32_t k = 0; k < array_size; k++, interface_index++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[2] = { i, interface_index };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 2,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (flat_matrix)
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}